

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O1

void __thiscall
Am_Inter_Location::Swap_With(Am_Inter_Location *this,Am_Inter_Location *other_obj,bool make_unique)

{
  bool tmp_as_line;
  Am_Object local_40;
  Am_Object tmp_ref_obj;
  int d;
  int c;
  int b;
  int a;
  
  tmp_ref_obj.data = (Am_Object_Data *)0x0;
  Get_Location(this,&tmp_as_line,&tmp_ref_obj,&a,&b,&c,&d);
  Copy_From(this,other_obj,make_unique);
  Am_Object::Am_Object(&local_40,&tmp_ref_obj);
  Set_Location(other_obj,tmp_as_line,&local_40,a,b,c,d,make_unique);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&tmp_ref_obj);
  return;
}

Assistant:

void
Am_Inter_Location::Swap_With(Am_Inter_Location &other_obj, bool make_unique)
{
  bool tmp_as_line;
  Am_Object tmp_ref_obj;
  int a, b, c, d;
  Get_Location(tmp_as_line, tmp_ref_obj, a, b, c, d);
  Copy_From(other_obj, make_unique);
  other_obj.Set_Location(tmp_as_line, tmp_ref_obj, a, b, c, d, make_unique);
}